

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcFurnitureType::IfcFurnitureType(IfcFurnitureType *this)

{
  *(undefined ***)&this->field_0x1c0 = &PTR__Object_007e6a70;
  *(undefined8 *)&this->field_0x1c8 = 0;
  *(char **)&this->field_0x1d0 = "IfcFurnitureType";
  IfcFurnishingElementType::IfcFurnishingElementType
            ((IfcFurnishingElementType *)this,&PTR_construction_vtable_24__0086f850);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x86f720;
  *(undefined8 *)&this->field_0x1c0 = 0x86f838;
  *(undefined8 *)&this->field_0x88 = 0x86f748;
  *(undefined8 *)&this->field_0x98 = 0x86f770;
  *(undefined8 *)&this->field_0xf0 = 0x86f798;
  *(undefined8 *)&this->field_0x148 = 0x86f7c0;
  *(undefined8 *)&this->field_0x180 = 0x86f7e8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x86f810;
  *(undefined1 **)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>).field_0x20;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>).field_0x20 = 0;
  return;
}

Assistant:

IfcFurnitureType() : Object("IfcFurnitureType") {}